

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O3

int __thiscall gmlc::networking::TcpServer::close(TcpServer *this,int __fd)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  int extraout_EAX;
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  *this_00;
  long lVar4;
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  *__range4;
  long lVar5;
  iterator __begin4;
  pointer psVar6;
  long lVar7;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  LOCK();
  (this->halted)._M_base._M_i = true;
  UNLOCK();
  psVar6 = (this->acceptors).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->acceptors).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)psVar1 - (long)psVar6 == 0x10) {
    TcpAcceptor::close((psVar6->
                       super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr,__fd);
  }
  else if (psVar6 != psVar1) {
    do {
      ::asio::basic_socket_acceptor<asio::ip::tcp,_asio::any_io_executor>::cancel
                (&((psVar6->
                   super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->acceptor_);
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar1);
    psVar1 = (this->acceptors).
             super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar6 = (this->acceptors).
                  super__Vector_base<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1; psVar6 = psVar6 + 1)
    {
      TcpAcceptor::close((psVar6->
                         super___shared_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,__fd);
    }
    std::
    vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
    ::clear(&this->acceptors);
  }
  local_30._M_device = &this->accepting;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  psVar2 = (this->connections).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (this->connections).
           super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  std::unique_lock<std::mutex>::unlock(&local_30);
  if (psVar3 != psVar2) {
    this_00 = &this->connections;
    lVar7 = (long)psVar3 - (long)psVar2 >> 4;
    lVar5 = lVar7 + (ulong)(lVar7 == 0);
    lVar4 = 0;
    do {
      TcpConnection::closeNoWait
                (*(TcpConnection **)
                  ((long)&(((this_00->
                            super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar4));
      lVar4 = lVar4 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar4 = 0;
    do {
      TcpConnection::waitOnClose
                (*(TcpConnection **)
                  ((long)&(((this_00->
                            super__Vector_base<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->
                          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + lVar4));
      lVar4 = lVar4 + 0x10;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    std::
    vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
    ::clear(this_00);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return extraout_EAX;
}

Assistant:

void TcpServer::close()
{
    halted = true;
    if (acceptors.size() == 1) {
        acceptors[0]->close();
    } else if (!acceptors.empty()) {
        // cancel first to give the threads some time to process
        for (auto& acc : acceptors) {
            acc->cancel();
        }
        for (auto& acc : acceptors) {
            acc->close();
        }
        acceptors.clear();
    }

    std::unique_lock<std::mutex> lock(accepting);
    auto sz = connections.size();
    lock.unlock();
    if (sz > 0) {
        for (decltype(sz) ii = 0; ii < sz; ++ii) {
            connections[ii]->closeNoWait();
        }
        for (decltype(sz) ii = 0; ii < sz; ++ii) {
            connections[ii]->waitOnClose();
        }
        connections.clear();
    }
}